

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O2

int * __thiscall
sisl::cartesian_cubic<int>::operator()(cartesian_cubic<int> *this,int d0,__va_list_tag *vl)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  uint local_2c;
  uint local_28;
  int local_24;
  
  uVar1 = vl->gp_offset;
  uVar5 = (ulong)uVar1;
  if (uVar5 < 0x29) {
    vl->gp_offset = (uint)(uVar5 + 8);
    uVar6 = *(uint *)((long)vl->reg_save_area + uVar5);
    if (uVar1 < 0x21) {
      puVar3 = (uint *)(uVar5 + 8 + (long)vl->reg_save_area);
      vl->gp_offset = uVar1 + 0x10;
      goto LAB_00152037;
    }
  }
  else {
    puVar3 = (uint *)vl->overflow_arg_area;
    vl->overflow_arg_area = puVar3 + 2;
    uVar6 = *puVar3;
  }
  puVar3 = (uint *)vl->overflow_arg_area;
  vl->overflow_arg_area = puVar3 + 2;
LAB_00152037:
  uVar1 = *puVar3;
  this->__zero = 0;
  local_2c = uVar1;
  local_28 = uVar6;
  local_24 = d0;
  bVar2 = in_bound(this,&local_24,(int *)&local_28,(int *)&local_2c);
  if (bVar2) {
    piVar4 = array_n<int,_3,_std::allocator<int>_>::operator()
                       (&this->_array,d0,(ulong)uVar6,(ulong)uVar1);
  }
  else {
    piVar4 = &this->__zero;
  }
  return piVar4;
}

Assistant:

virtual const T& operator()(int d0, va_list vl) const {
            unsigned int _x = d0, _y = 0, _z = 0;
            _y = va_arg(vl, unsigned int);
            _z = va_arg(vl, unsigned int);
            T *__hack = (T *)&__zero; *__hack = 0;

            if(!in_bound(_x, _y, _z)) return __zero;
            return _array(_x, _y, _z);
        }